

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int is_C_identifier(char *name)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  
  cVar1 = *name;
  if ((long)cVar1 == 0x22) {
    cVar1 = name[1];
    ppuVar2 = __ctype_b_loc();
    if (((((*ppuVar2)[cVar1] >> 10 & 1) != 0) || (cVar1 == '_')) || (cVar1 == '$')) {
      pcVar3 = name + 2;
      while( true ) {
        cVar1 = *pcVar3;
        if ((long)cVar1 == 0x22) {
          return 1;
        }
        if (((((*ppuVar2)[cVar1] & 8) == 0) && (cVar1 != '$')) && (cVar1 != '_')) break;
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((((*ppuVar2)[cVar1] >> 10 & 1) != 0) || (cVar1 == '_')) || (cVar1 == '$')) {
      pcVar3 = name + 1;
      while( true ) {
        cVar1 = *pcVar3;
        if ((long)cVar1 == 0) {
          return 1;
        }
        if (((((*ppuVar2)[cVar1] & 8) == 0) && (cVar1 != '$')) && (cVar1 != '_')) break;
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int is_C_identifier(char *name)
{
    register char *s;
    register int c;

    s = name;
    c = *s;
    if (c == '"')
    {
	c = *++s;
	if (!isalpha(c) && c != '_' && c != '$')
	    return (0);
	while ((c = *++s) != '"')
	{
	    if (!isalnum(c) && c != '_' && c != '$')
		return (0);
	}
	return (1);
    }

    if (!isalpha(c) && c != '_' && c != '$')
	return (0);
    while ((c = *++s))
    {
	if (!isalnum(c) && c != '_' && c != '$')
	    return (0);
    }
    return (1);
}